

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

stbi_uc * stbi_load_gif_from_memory
                    (stbi_uc *buffer,int len,int **delays,int *x,int *y,int *z,int *comp,
                    int req_comp)

{
  int h;
  int bytes_per_pixel;
  int iVar1;
  stbi__context *__src;
  stbi_uc *psVar2;
  int *piVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  size_t __size;
  long lVar7;
  uchar *image;
  long *in_FS_OFFSET;
  stbi__context s;
  uchar *local_89b0;
  size_t local_8990;
  stbi__context local_8980;
  stbi__gif local_88a0;
  
  local_8980.io.read = (_func_int_void_ptr_char_ptr_int *)0x0;
  local_8980.read_from_callbacks = 0;
  local_8980.callback_already_read = 0;
  local_8980.img_buffer_end = buffer + len;
  piVar4 = y;
  local_8980.img_buffer = buffer;
  local_8980.img_buffer_original = buffer;
  local_8980.img_buffer_original_end = local_8980.img_buffer_end;
  iVar1 = stbi__gif_test(&local_8980);
  if (iVar1 == 0) {
    in_FS_OFFSET[-6] = (long)"not GIF";
    local_89b0 = (uchar *)0x0;
  }
  else {
    lVar6 = 0;
    memset(&local_88a0,0,0x8870);
    if (delays != (int **)0x0) {
      *delays = (int *)0x0;
    }
    __src = (stbi__context *)stbi__gif_load_next(&local_8980,&local_88a0,comp,0,(stbi_uc *)piVar4);
    local_89b0 = (uchar *)0x0;
    if (__src != (stbi__context *)0x0 && __src != &local_8980) {
      local_8990 = 4;
      lVar6 = 0;
      lVar7 = 0;
      local_89b0 = (stbi_uc *)0x0;
      do {
        *x = local_88a0.w;
        *y = local_88a0.h;
        iVar5 = local_88a0.h * local_88a0.w;
        iVar1 = iVar5 * 4;
        __size = (size_t)(((int)lVar6 + 1) * iVar1);
        if (local_89b0 == (stbi_uc *)0x0) {
          local_89b0 = (uchar *)malloc(__size);
          if (local_89b0 != (stbi_uc *)0x0) {
            if (delays != (int **)0x0) {
              piVar3 = (int *)malloc(local_8990);
              *delays = piVar3;
              if (piVar3 == (int *)0x0) goto LAB_00139fd5;
            }
            goto LAB_00139ead;
          }
          stbi__load_gif_main_outofmem(&local_88a0,(stbi_uc *)0x0,delays);
LAB_0013a002:
          local_89b0 = (uchar *)0x0;
          goto LAB_0013a007;
        }
        psVar2 = (stbi_uc *)realloc(local_89b0,__size);
        if (psVar2 == (stbi_uc *)0x0) {
LAB_00139fd5:
          stbi__load_gif_main_outofmem(&local_88a0,local_89b0,delays);
          goto LAB_0013a002;
        }
        local_89b0 = psVar2;
        if (delays != (int **)0x0) {
          piVar3 = (int *)realloc(*delays,local_8990);
          if (piVar3 == (int *)0x0) goto LAB_00139fd5;
          *delays = piVar3;
        }
LAB_00139ead:
        memcpy(local_89b0 + (int)lVar6 * iVar1,__src,(long)iVar1);
        if (lVar6 != 0) {
          lVar7 = (long)local_89b0 - (long)(iVar5 * 8);
        }
        if (delays != (int **)0x0) {
          (*delays)[lVar6] = local_88a0.delay;
        }
        __src = (stbi__context *)
                stbi__gif_load_next(&local_8980,&local_88a0,comp,(int)lVar7,(stbi_uc *)piVar4);
        lVar6 = lVar6 + 1;
      } while ((__src != &local_8980) &&
              (local_8990 = local_8990 + 4, __src != (stbi__context *)0x0));
    }
    free(local_88a0.out);
    free(local_88a0.history);
    free(local_88a0.background);
    if ((req_comp & 0xfffffffbU) != 0) {
      local_89b0 = stbi__convert_format
                             (local_89b0,4,req_comp,local_88a0.w * (int)lVar6,local_88a0.h);
    }
    *z = (int)lVar6;
  }
LAB_0013a007:
  piVar4 = &stbi__vertically_flip_on_load_global;
  if (*(int *)((long)in_FS_OFFSET + -0x24) != 0) {
    piVar4 = (int *)(*in_FS_OFFSET + -0x28);
  }
  if ((*piVar4 != 0) && (iVar1 = *z, 0 < iVar1)) {
    iVar5 = *x;
    h = *y;
    bytes_per_pixel = *comp;
    image = local_89b0;
    do {
      stbi__vertical_flip(image,iVar5,h,bytes_per_pixel);
      image = image + h * iVar5 * bytes_per_pixel;
      iVar1 = iVar1 + -1;
    } while (iVar1 != 0);
  }
  return local_89b0;
}

Assistant:

STBIDEF stbi_uc *stbi_load_gif_from_memory(stbi_uc const *buffer, int len, int **delays, int *x, int *y, int *z, int *comp, int req_comp)
{
   unsigned char *result;
   stbi__context s;
   stbi__start_mem(&s,buffer,len);

   result = (unsigned char*) stbi__load_gif_main(&s, delays, x, y, z, comp, req_comp);
   if (stbi__vertically_flip_on_load) {
      stbi__vertical_flip_slices( result, *x, *y, *z, *comp );
   }

   return result;
}